

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

uint8 * __thiscall
caffe::DropoutParameter::InternalSerializeWithCachedSizesToArray
          (DropoutParameter *this,bool deterministic,uint8 *target)

{
  float fVar1;
  void *pvVar2;
  uint8 *puVar3;
  
  if (((this->_has_bits_).has_bits_[0] & 1) != 0) {
    fVar1 = this->dropout_ratio_;
    *target = '\r';
    *(float *)(target + 1) = fVar1;
    target = target + 5;
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) == 0) {
    return target;
  }
  puVar3 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),target);
  return puVar3;
}

Assistant:

::google::protobuf::uint8* DropoutParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.DropoutParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional float dropout_ratio = 1 [default = 0.5];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(1, this->dropout_ratio(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.DropoutParameter)
  return target;
}